

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerlaw_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::powerlaw_dist<float>::icdf(powerlaw_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar2;
  double dVar3;
  undefined4 local_4;
  
  if ((in_XMM0_Da <= 0.0) || (1.0 <= in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      rVar2 = param_type::theta(in_RDI);
      dVar3 = param_type::gamma(in_RDI,(double)(ulong)(uint)(1.0 - in_XMM0_Da));
      dVar3 = std::pow((double)(ulong)(uint)(1.0 - in_XMM0_Da),
                       (double)(ulong)(uint)(-1.0 / SUB84(dVar3,0)));
      local_4 = rVar2 * SUB84(dVar3,0);
    }
    else {
      local_4 = std::numeric_limits<float>::infinity();
    }
  }
  else {
    local_4 = param_type::theta(in_RDI);
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return P.theta();
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return P.theta() * math::pow(1 - x, -1 / P.gamma());
    }